

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fadop.h
# Opt level: O0

value_type __thiscall
FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>
::dx(FadBinaryMul<FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>,_FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>_>
     *this,int i)

{
  FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
  *in_RDI;
  value_type vVar1;
  value_type vVar2;
  value_type vVar3;
  value_type vVar4;
  int in_stack_ffffffffffffffcc;
  
  vVar1 = FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
          ::dx(in_RDI,in_stack_ffffffffffffffcc);
  vVar2 = FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
          ::val((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
                 *)0x176efd7);
  vVar3 = FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
          ::dx((FadExpr<FadBinaryAdd<FadExpr<FadBinaryMinus<FadExpr<FadBinaryMinus<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryMul<FadCst<double>,_Fad<double>_>_>_>_>,_Fad<double>_>_>
                *)in_RDI,in_stack_ffffffffffffffcc);
  vVar4 = FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
          ::val((FadExpr<FadBinaryMul<FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>,_FadExpr<FadBinaryAdd<FadCst<double>,_Fad<double>_>_>_>_>
                 *)0x176f002);
  return vVar1 * vVar2 + vVar3 * vVar4;
}

Assistant:

const value_type dx(int i) const {return  left_.dx(i) * right_.val() + right_.dx(i) * left_.val();}